

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Value * __thiscall
soul::heart::AggregateInitialiserList::getAsConstant
          (Value *__return_storage_ptr__,AggregateInitialiserList *this)

{
  Category CVar1;
  pool_ref<soul::heart::Expression> *ppVar2;
  size_t sVar3;
  bool bVar4;
  size_t index;
  Type *destType;
  long lVar5;
  Value result;
  Value v;
  Type local_100;
  Value local_e8;
  ArrayWithPreallocation<unsigned_long,_4UL> local_a8;
  Value local_70;
  
  destType = &this->type;
  Type::Type(&local_100,destType);
  soul::Value::zeroInitialiser(&local_e8,&local_100);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_100.structure);
  ppVar2 = (this->items).items;
  sVar3 = (this->items).numActive;
  lVar5 = 0;
  index = 0;
  do {
    if (sVar3 << 3 == lVar5) {
      soul::Value::Value(__return_storage_ptr__,&local_e8);
      break;
    }
    (**(code **)(**(long **)((long)&ppVar2->object + lVar5) + 0x38))(&local_70);
    if (local_70.type.category == invalid) {
      (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
      (__return_storage_ptr__->allocatedData).allocatedSize = 0;
      (__return_storage_ptr__->type).category = invalid;
      (__return_storage_ptr__->type).arrayElementCategory = invalid;
      (__return_storage_ptr__->type).isRef = false;
      (__return_storage_ptr__->type).isConstant = false;
      (__return_storage_ptr__->type).primitiveType = invalid;
      (__return_storage_ptr__->type).boundingSize = 0;
      (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
      (__return_storage_ptr__->allocatedData).allocatedData.items =
           (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
      (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
      (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
LAB_0026aa48:
      bVar4 = false;
    }
    else {
      CVar1 = destType->category;
      if (CVar1 != structure) {
        if ((CVar1 != vector) && (CVar1 != array || (this->type).boundingSize == 0)) {
          soul::Value::castToTypeExpectingSuccess(__return_storage_ptr__,&local_70,destType);
          goto LAB_0026aa48;
        }
      }
      SubElementPath::SubElementPath((SubElementPath *)&local_a8,index);
      soul::Value::modifySubElementInPlace(&local_e8,(SubElementPath *)&local_a8,&local_70);
      index = index + 1;
      ArrayWithPreallocation<unsigned_long,_4UL>::clear(&local_a8);
      bVar4 = true;
    }
    soul::Value::~Value(&local_70);
    lVar5 = lVar5 + 8;
  } while (bVar4);
  soul::Value::~Value(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto result = Value::zeroInitialiser (type);
            size_t index = 0;

            for (auto& i : items)
            {
                auto v = i->getAsConstant();

                if (! v.isValid())
                    return {};

                if (! (type.isStruct() || type.isFixedSizeArray() || type.isVector()))
                    return v.castToTypeExpectingSuccess (type);

                result.modifySubElementInPlace (index++, v);
            }

            return result;
        }